

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LUX_Run03.hh
# Opt level: O0

double __thiscall
DetectorExample_LUX_RUN03::FitEF
          (DetectorExample_LUX_RUN03 *this,double xPos_mm,double yPos_mm,double zPos_mm)

{
  uint uVar1;
  ostream *this_00;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double finalEF;
  double zPos_mm_local;
  double yPos_mm_local;
  double xPos_mm_local;
  DetectorExample_LUX_RUN03 *this_local;
  
  dVar2 = pow(zPos_mm,1.0);
  dVar3 = pow(zPos_mm,2.0);
  dVar4 = pow(zPos_mm,3.0);
  dVar5 = pow(zPos_mm,4.0);
  dVar6 = pow(zPos_mm,5.0);
  this_local = (DetectorExample_LUX_RUN03 *)
               (dVar6 * -1.011e-11 +
               dVar5 * 1.5049e-08 +
               dVar4 * -8.7098e-06 + dVar3 * 0.0024485 + dVar2 * -0.2209 + 158.92);
  if ((((double)this_local <= 1.0) || (100000.0 < (double)this_local)) ||
     (uVar1 = std::isnan((double)this_local), (uVar1 & 1) != 0)) {
    this_00 = std::operator<<((ostream *)&std::cerr,
                              "ERR: Very weird drift electric field value!! Are you sure you didn\'t forget to change LUX numbers for your own detector??"
                             );
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    this_local = (DetectorExample_LUX_RUN03 *)0x3ff0000000000000;
  }
  return (double)this_local;
}

Assistant:

double FitEF(double xPos_mm, double yPos_mm,
               double zPos_mm) override {  // in V/cm

    double finalEF =
        158.92  // NOTE: DO NOT JUST RETURN A CONSTANT, THAT IS A SILLY USE of
                // FitEF
        - 0.2209000 * pow(zPos_mm, 1.) + 0.0024485 * pow(zPos_mm, 2.) -
        8.7098e-6 * pow(zPos_mm, 3.) + 1.5049e-8 * pow(zPos_mm, 4.) -
        1.0110e-11 * pow(zPos_mm, 5.);
    if (finalEF <= FIELD_MIN || finalEF > 1e5 || std::isnan(finalEF)) {
      cerr << "ERR: Very weird drift electric field value!! Are you sure you "
              "didn't forget to change LUX numbers for your own detector??"
           << endl;
      return FIELD_MIN;
    } else
      return finalEF;
  }